

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O3

void __thiscall trng::truncated_normal_dist<float>::param_type::update_Phi(param_type *this)

{
  float fVar1;
  result_type_conflict1 rVar2;
  
  if (this->a_ == -INFINITY) {
    rVar2 = 0.0;
  }
  else {
    fVar1 = ((this->a_ - this->mu_) / this->sigma_) * 0.70710677;
    if (-0.47693625 <= fVar1) {
      if (fVar1 <= 0.47693625) {
        fVar1 = erff(fVar1);
        rVar2 = fVar1 * 0.5 + 0.5;
      }
      else {
        fVar1 = erfcf(fVar1);
        rVar2 = fVar1 * -0.5 + 1.0;
      }
    }
    else {
      fVar1 = erfcf(-fVar1);
      rVar2 = fVar1 * 0.5;
    }
  }
  this->Phi_a = rVar2;
  if (this->b_ == INFINITY) {
    rVar2 = 1.0;
  }
  else {
    fVar1 = ((this->b_ - this->mu_) / this->sigma_) * 0.70710677;
    if (-0.47693625 <= fVar1) {
      if (fVar1 <= 0.47693625) {
        fVar1 = erff(fVar1);
        rVar2 = fVar1 * 0.5 + 0.5;
      }
      else {
        fVar1 = erfcf(fVar1);
        rVar2 = fVar1 * -0.5 + 1.0;
      }
    }
    else {
      fVar1 = erfcf(-fVar1);
      rVar2 = fVar1 * 0.5;
    }
  }
  this->Phi_b = rVar2;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
      void update_Phi() {
        if (a_ > -math::numeric_limits<result_type>::infinity())
          Phi_a = math::Phi((a_ - mu_) / sigma_);
        else
          Phi_a = result_type(0);
        if (b_ < math::numeric_limits<result_type>::infinity())
          Phi_b = math::Phi((b_ - mu_) / sigma_);
        else
          Phi_b = result_type(1);
      }